

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vq.c
# Opt level: O1

float prune_distance(float *x,float *y,int Ndim,float mindist)

{
  int iVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = (*x - *y) * (*x - *y);
  if (1 < Ndim) {
    lVar2 = 0;
    do {
      fVar3 = (x[lVar2 + 1] - y[lVar2 + 1]) * (x[lVar2 + 1] - y[lVar2 + 1]) + fVar3;
      if (mindist < fVar3) {
        return fVar3;
      }
      iVar1 = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (Ndim + -2 != iVar1);
  }
  return fVar3;
}

Assistant:

float prune_distance(float *x, float *y, int Ndim, float mindist)
{
	auto int i;
	auto float dist, t;

	t = *x++ - *y++;
	dist = t * t;
	for (i = 1; i < Ndim; ++i) {
		t = *x++ - *y++;
		dist += t * t;
		if (dist > mindist)
			break;
	}
	return (dist);
}